

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O2

int MRIStepWriteCoupling(void *arkode_mem,FILE *fp)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"MRIStepWriteCoupling",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    if (step_mem->MRIC == (MRIStepCoupling)0x0) {
      iVar1 = -0x15;
      arkProcessError(ark_mem,-0x15,0x491,"MRIStepWriteCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                      ,"Coupling structure is NULL");
    }
    else {
      fwrite("\nMRIStep coupling structure:\n",0x1d,1,(FILE *)fp);
      MRIStepCoupling_Write(step_mem->MRIC,fp);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int MRIStepWriteCoupling(void* arkode_mem, FILE* fp)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check that coupling structure is non-NULL (otherwise report error) */
  if (step_mem->MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "Coupling structure is NULL");
    return (ARK_MEM_NULL);
  }

  /* write coupling structure to specified file */
  fprintf(fp, "\nMRIStep coupling structure:\n");
  MRIStepCoupling_Write(step_mem->MRIC, fp);

  return (ARK_SUCCESS);
}